

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_mtsafe_st_env_infrastructure.cpp
# Opt level: O1

void __thiscall
so_5::env_infrastructures::simple_mtsafe::impl::
env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>::launch
          (env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>
           *this,env_init_t *init_fn)

{
  _Manager_type p_Var1;
  _Any_data local_28;
  _Manager_type local_18;
  _Invoker_type local_10;
  
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  local_18 = (_Manager_type)0x0;
  local_10 = init_fn->_M_invoker;
  p_Var1 = (init_fn->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_28._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(init_fn->super__Function_base)._M_functor;
    local_28._8_8_ = *(undefined8 *)((long)&(init_fn->super__Function_base)._M_functor + 8);
    (init_fn->super__Function_base)._M_manager = (_Manager_type)0x0;
    init_fn->_M_invoker = (_Invoker_type)0x0;
    local_18 = p_Var1;
  }
  run_default_dispatcher_and_go_further(this,(env_init_t *)&local_28);
  if (local_18 != (_Manager_type)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return;
}

Assistant:

static const char * disp_type_part() { return "mtsafe_st_env"; }